

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec * cram_huffman_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte *pbVar1;
  byte bVar2;
  cram_codec *__ptr;
  uint *__base;
  long lVar3;
  code *pcVar4;
  byte *pbVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  size_t __nmemb;
  bool bVar15;
  
  bVar2 = *data;
  uVar8 = (uint)bVar2;
  lVar14 = 1;
  if ((char)bVar2 < '\0') {
    uVar9 = (uint)bVar2;
    uVar8 = (uint)(byte)data[1];
    if (bVar2 < 0xc0) {
      uVar8 = (uVar9 & 0x3f) << 8 | uVar8;
      lVar14 = 2;
    }
    else if (bVar2 < 0xe0) {
      uVar8 = (uVar9 & 0x1f) << 0x10 | uVar8 << 8 | (uint)(byte)data[2];
      lVar14 = 3;
    }
    else if (bVar2 < 0xf0) {
      uVar8 = (uVar9 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)(byte)data[2] << 8 | (uint)(byte)data[3]
      ;
      lVar14 = 4;
    }
    else {
      uVar8 = (byte)data[4] & 0xf |
              (uint)(byte)data[3] << 4 | (uint)(byte)data[2] << 0xc | uVar8 << 0x14 | uVar9 << 0x1c;
      lVar14 = 5;
    }
  }
  __ptr = (cram_codec *)calloc(1,0x240);
  if (__ptr != (cram_codec *)0x0) {
    __ptr->free = cram_huffman_decode_free;
    (__ptr->field_6).huffman.ncodes = uVar8;
    __nmemb = (size_t)(int)uVar8;
    __base = (uint *)malloc(__nmemb << 4);
    (__ptr->field_6).e_byte_array_len.len_dat = __base;
    if (__base == (uint *)0x0) {
      free(__ptr);
    }
    else {
      lVar3 = (long)size;
      pbVar1 = (byte *)(data + lVar3);
      pbVar5 = (byte *)(data + lVar14);
      bVar15 = lVar14 < lVar3;
      if (lVar14 < lVar3 && 0 < (int)uVar8) {
        lVar14 = 1;
        puVar6 = __base;
        do {
          bVar2 = *pbVar5;
          uVar9 = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar10 = (uint)bVar2;
            uVar9 = (uint)pbVar5[1];
            if (bVar2 < 0xc0) {
              uVar9 = (uVar10 & 0x3f) << 8 | uVar9;
              lVar13 = 2;
            }
            else if (bVar2 < 0xe0) {
              uVar9 = (uVar10 & 0x1f) << 0x10 | uVar9 << 8 | (uint)pbVar5[2];
              lVar13 = 3;
            }
            else if (bVar2 < 0xf0) {
              uVar9 = (uVar10 & 0xf) << 0x18 | uVar9 << 0x10 | (uint)pbVar5[2] << 8 |
                      (uint)pbVar5[3];
              lVar13 = 4;
            }
            else {
              uVar9 = pbVar5[4] & 0xf |
                      (uint)pbVar5[3] << 4 | (uint)pbVar5[2] << 0xc | uVar9 << 0x14 | uVar10 << 0x1c
              ;
              lVar13 = 5;
            }
          }
          else {
            lVar13 = 1;
          }
          *puVar6 = uVar9;
          pbVar5 = pbVar5 + lVar13;
          bVar15 = pbVar5 < pbVar1;
          if ((long)__nmemb <= lVar14) break;
          puVar6 = puVar6 + 4;
          lVar14 = lVar14 + 1;
        } while (pbVar5 < pbVar1);
      }
      if (bVar15) {
        bVar2 = *pbVar5;
        uVar9 = (uint)bVar2;
        lVar14 = 1;
        if ((char)bVar2 < '\0') {
          uVar10 = (uint)bVar2;
          uVar9 = (uint)pbVar5[1];
          if (bVar2 < 0xc0) {
            uVar9 = (uVar10 & 0x3f) << 8 | uVar9;
            lVar14 = 2;
          }
          else if (bVar2 < 0xe0) {
            uVar9 = (uVar10 & 0x1f) << 0x10 | uVar9 << 8 | (uint)pbVar5[2];
            lVar14 = 3;
          }
          else if (bVar2 < 0xf0) {
            uVar9 = (uVar10 & 0xf) << 0x18 | uVar9 << 0x10 | (uint)pbVar5[2] << 8 | (uint)pbVar5[3];
            lVar14 = 4;
          }
          else {
            uVar9 = pbVar5[4] & 0xf |
                    (uint)pbVar5[3] << 4 | (uint)pbVar5[2] << 0xc | uVar9 << 0x14 | uVar10 << 0x1c;
            lVar14 = 5;
          }
        }
        if (uVar9 == uVar8) {
          if (uVar8 == 0) {
            return __ptr;
          }
          pbVar5 = pbVar5 + lVar14;
          uVar9 = 0;
          if (pbVar5 < pbVar1 && 0 < (int)uVar8) {
            puVar6 = __base + 3;
            uVar9 = 0;
            lVar14 = 1;
            do {
              bVar2 = *pbVar5;
              uVar10 = (uint)bVar2;
              if ((char)bVar2 < '\0') {
                uVar11 = (uint)bVar2;
                uVar10 = (uint)pbVar5[1];
                if (bVar2 < 0xc0) {
                  uVar10 = (uVar11 & 0x3f) << 8 | uVar10;
                  lVar13 = 2;
                }
                else if (bVar2 < 0xe0) {
                  uVar10 = (uVar11 & 0x1f) << 0x10 | uVar10 << 8 | (uint)pbVar5[2];
                  lVar13 = 3;
                }
                else if (bVar2 < 0xf0) {
                  uVar10 = (uVar11 & 0xf) << 0x18 | uVar10 << 0x10 | (uint)pbVar5[2] << 8 |
                           (uint)pbVar5[3];
                  lVar13 = 4;
                }
                else {
                  uVar10 = pbVar5[4] & 0xf |
                           (uint)pbVar5[3] << 4 |
                           (uint)pbVar5[2] << 0xc | uVar10 << 0x14 | uVar11 << 0x1c;
                  lVar13 = 5;
                }
              }
              else {
                lVar13 = 1;
              }
              *puVar6 = uVar10;
              pbVar5 = pbVar5 + lVar13;
              if ((int)uVar9 <= (int)uVar10) {
                uVar9 = uVar10;
              }
              if ((long)__nmemb <= lVar14) break;
              puVar6 = puVar6 + 4;
              lVar14 = lVar14 + 1;
            } while (pbVar5 < pbVar1);
          }
          if (((long)pbVar5 - (long)data == lVar3) && ((int)uVar9 < (int)uVar8)) {
            qsort(__base,__nmemb,0x10,code_sort);
            if (0 < (int)uVar8) {
              uVar9 = 0xffffffff;
              uVar7 = 0;
              uVar10 = 0;
              do {
                uVar9 = uVar9 + 1;
                uVar11 = __base[uVar7 * 4 + 3];
                iVar12 = uVar11 - uVar10;
                if (iVar12 != 0 && (int)uVar10 <= (int)uVar11) {
                  do {
                    uVar9 = uVar9 * 2;
                    iVar12 = iVar12 + -1;
                    uVar10 = uVar11;
                  } while (iVar12 != 0);
                }
                __base[uVar7 * 4 + 2] = uVar9;
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar8);
              if (0 < (int)uVar8) {
                puVar6 = __base + 3;
                lVar14 = 0;
                uVar9 = 0;
                uVar10 = 0;
                do {
                  if ((int)uVar9 < (int)*puVar6) {
                    uVar10 = puVar6[-1] + (int)lVar14;
                    uVar9 = *puVar6;
                  }
                  puVar6[-2] = uVar10;
                  lVar14 = lVar14 + -1;
                  puVar6 = puVar6 + 4;
                } while (-lVar14 != (ulong)uVar8);
              }
            }
            __ptr->codec = E_HUFFMAN;
            if (option - E_BYTE < 2) {
              if (__base[3] == 0) {
                pcVar4 = cram_huffman_decode_char0;
              }
              else {
                pcVar4 = cram_huffman_decode_char;
              }
            }
            else {
              if (option == E_BYTE_ARRAY_BLOCK) {
                abort();
              }
              if (__base[3] == 0) {
                pcVar4 = cram_huffman_decode_int0;
              }
              else {
                pcVar4 = cram_huffman_decode_int;
              }
            }
            __ptr->decode = pcVar4;
            return __ptr;
          }
          cram_huffman_decode_init_cold_3();
        }
        else {
          cram_huffman_decode_init_cold_2();
        }
      }
      else {
        cram_huffman_decode_init_cold_1();
      }
    }
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_huffman_decode_init(char *data, int size,
				     enum cram_external_type option,
				     int version) {
    int32_t ncodes, i, j;
    char *cp = data, *data_end = &data[size];
    cram_codec *h;
    cram_huffman_code *codes;
    int32_t val, last_len, max_len = 0;
    
    cp += itf8_get(cp, &ncodes);
    h = calloc(1, sizeof(*h));
    if (!h)
	return NULL;

    h->free   = cram_huffman_decode_free;

    h->huffman.ncodes = ncodes;
    codes = h->huffman.codes = malloc(ncodes * sizeof(*codes));
    if (!codes) {
	free(h);
	return NULL;
    }

    /* Read symbols and bit-lengths */
    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].symbol);
    }

    if (cp >= data_end) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }
    cp += itf8_get(cp, &i);
    if (i != ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    if (ncodes == 0) {
	/* NULL huffman stream */
	return h;
    }

    for (i = 0; i < ncodes && cp < data_end; i++) {
	cp += itf8_get(cp, &codes[i].len);
	if (max_len < codes[i].len)
	    max_len = codes[i].len;
    }
    if (cp - data != size || max_len >= ncodes) {
	fprintf(stderr, "Malformed huffman header stream\n");
	free(h);
	return NULL;
    }

    /* Sort by bit length and then by symbol value */
    qsort(codes, ncodes, sizeof(*codes), code_sort);

    /* Assign canonical codes */
    val = -1, last_len = 0;
    for (i = 0; i < ncodes; i++) {
	val++;
	if (codes[i].len > last_len) {
	    while (codes[i].len > last_len) {
		val <<= 1;
		last_len++;
	    }
	}
	codes[i].code = val;
    }

    /*
     * Compute the next starting point, offset by the i'th value.
     * For example if codes 10, 11, 12, 13 are 30, 31, 32, 33 then
     * codes[10..13].p = 30 - 10.
     */
    last_len = 0;
    for (i = j = 0; i < ncodes; i++) {
	if (codes[i].len > last_len) {
	    j = codes[i].code - i;
	    last_len = codes[i].len;
	}
	codes[i].p = j;
    }

//    puts("==HUFF LEN==");
//    for (i = 0; i <= last_len+1; i++) {
//	printf("len %d=%d prefix %d\n", i, h->huffman.lengths[i], h->huffman.prefix[i]); 
//    }
//    puts("===HUFFMAN CODES===");
//    for (i = 0; i < ncodes; i++) {
//	int j;
//	printf("%d: %d %d %d ", i, codes[i].symbol, codes[i].len, codes[i].code);
//	j = codes[i].len;
//	while (j) {
//	    putchar(codes[i].code & (1 << --j) ? '1' : '0');
//	}
//	printf(" %d\n", codes[i].code);
//    }

    h->codec  = E_HUFFMAN;
    if (option == E_BYTE || option == E_BYTE_ARRAY) {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_char0;
	else
	    h->decode = cram_huffman_decode_char;
    } else if (option == E_BYTE_ARRAY_BLOCK) {
	abort();
    } else {
	if (h->huffman.codes[0].len == 0)
	    h->decode = cram_huffman_decode_int0;
	else
	    h->decode = cram_huffman_decode_int;
    }

    return (cram_codec *)h;
}